

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver_tests.cpp
# Opt level: O1

void __thiscall httpserver_tests::test_query_parameters::test_method(test_query_parameters *this)

{
  lazy_ostream *assertion_descr;
  _Alloc_hider _Var1;
  int iVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar5;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  assertion_result local_1b0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  char *local_110;
  char *local_108;
  assertion_result local_100;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  bool local_80;
  string uri;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uri._M_dataplus._M_p = (pointer)&uri.field_2;
  uri._M_string_length = 0;
  uri.field_2._M_local_buf[0] = '\0';
  pvVar3 = (iterator)0x2d;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&uri,0,0,"localhost:8080/rest/headers/someresource.json",0x2d);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  _Var1 = uri._M_dataplus;
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"p1","");
  _cVar5 = 0x3f756c;
  GetQueryParameterFromUri
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,_Var1._M_p,(string *)local_58);
  local_1b0._0_8_ = CONCAT71(local_1b0._1_7_,local_80) ^ 1;
  local_1b0.m_message.px = (element_type *)0x0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = &local_c0;
  local_c0._M_dataplus._M_p = "!GetQueryParameterFromUri(uri.c_str(), \"p1\").has_value()";
  local_c0._M_string_length = 0xec3164;
  local_130[0] = '\0';
  local_140._8_8_ = &PTR__lazy_ostream_013d3df0;
  local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_168 = "";
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b0,(lazy_ostream *)(local_140 + 8),1,0,WARN,_cVar5,(size_t)&local_170,0x12);
  boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  if (local_80 == true) {
    local_80 = false;
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  pvVar4 = (iterator)0x34;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&uri,0,uri._M_string_length,"localhost:8080/rest/endpoint/someresource.json?p1=v1",0x34
            );
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  _Var1 = uri._M_dataplus;
  local_1b0.m_message.px = (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
  local_1b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"p1","");
  GetQueryParameterFromUri
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,_Var1._M_p,&local_c0);
  if (local_80 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,"v1");
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_108 = "";
    aStack_48._8_8_ = &local_118;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
    aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_120 = (string *)local_140;
    local_140._0_8_ = "v1";
    local_130[0] = '\0';
    local_140._8_8_ = &PTR__lazy_ostream_013d5440;
    local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)&local_1b0,1,2,REQUIRE,0xec319a,(size_t)&local_110,0x16,
               local_58,"\"v1\"",(lazy_ostream *)(local_140 + 8));
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    if (local_80 == true) {
      local_80 = false;
      if ((undefined1 *)local_a0._0_8_ != local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x17;
    file_01.m_begin = (iterator)&local_1c0;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d0,
               msg_01);
    _Var1 = uri._M_dataplus;
    local_58._0_8_ = &aStack_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"p2","");
    _cVar5 = 0x3f7936;
    GetQueryParameterFromUri
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,_Var1._M_p,(string *)local_58);
    local_1b0._0_8_ = CONCAT71(local_1b0._1_7_,local_80) ^ 1;
    local_1b0.m_message.px = (element_type *)0x0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0._M_dataplus._M_p = "!GetQueryParameterFromUri(uri.c_str(), \"p2\").has_value()";
    local_c0._M_string_length = 0xec320b;
    assertion_descr = (lazy_ostream *)(local_140 + 8);
    local_130[0] = '\0';
    local_140._8_8_ = &PTR__lazy_ostream_013d3df0;
    local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1d8 = "";
    pvVar3 = (iterator)0x0;
    local_120 = &local_c0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,assertion_descr,1,0,WARN,_cVar5,(size_t)&local_1e0,0x17);
    boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
    if (local_80 == true) {
      local_80 = false;
      if ((undefined1 *)local_a0._0_8_ != local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
    }
    pvVar4 = (iterator)0x2c;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&uri,0,uri._M_string_length,"/rest/endpoint/someresource.json?p1=v1&p2=v2",0x2c);
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x1b;
    file_02.m_begin = (iterator)&local_1f0;
    msg_02.m_end = pvVar3;
    msg_02.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
               msg_02);
    _Var1 = uri._M_dataplus;
    local_1b0.m_message.px = (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
    local_1b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_198 = "";
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"p1","");
    GetQueryParameterFromUri
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,_Var1._M_p,&local_c0);
    if (local_80 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                      "v1");
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_100.m_message.px = (element_type *)0x0;
      local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
      ;
      local_108 = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
      aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_48._8_8_ = &local_118;
      local_140._0_8_ = "v1";
      local_130[0] = '\0';
      local_140._8_8_ = &PTR__lazy_ostream_013d5440;
      local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
      local_120 = (string *)local_140;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      boost::test_tools::tt_detail::report_assertion
                (&local_100,(lazy_ostream *)&local_1b0,1,2,REQUIRE,0xec319a,(size_t)&local_110,0x1b,
                 local_58,"\"v1\"",assertion_descr);
      boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
      if (local_80 == true) {
        local_80 = false;
        if ((undefined1 *)local_a0._0_8_ != local_90) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
      ;
      local_208 = "";
      local_220 = &boost::unit_test::basic_cstring<char_const>::null;
      local_218 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1c;
      file_03.m_begin = (iterator)&local_210;
      msg_03.m_end = pvVar4;
      msg_03.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
                 msg_03);
      _Var1 = uri._M_dataplus;
      local_1b0.m_message.px = (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
      local_1b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_198 = "";
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"p2","");
      GetQueryParameterFromUri
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_a0,_Var1._M_p,&local_c0);
      if (local_80 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a0,"v2");
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(iVar2 == 0);
        local_100.m_message.px = (element_type *)0x0;
        local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
        ;
        local_108 = "";
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
        aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        aStack_48._8_8_ = &local_118;
        local_140._0_8_ = "v2";
        local_130[0] = '\0';
        local_140._8_8_ = &PTR__lazy_ostream_013d5440;
        local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
        local_120 = (string *)local_140;
        pvVar3 = (iterator)0x2;
        local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_100,(lazy_ostream *)&local_1b0,1,2,REQUIRE,0xec3239,(size_t)&local_110,
                   0x1c,local_58,"\"v2\"",assertion_descr);
        boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
        if (local_80 == true) {
          local_80 = false;
          if ((undefined1 *)local_a0._0_8_ != local_90) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        pvVar4 = (iterator)0x2c;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&uri,0,uri._M_string_length,"/rest/endpoint/someresource.json?p1=v1&p1=v2",0x2c);
        local_230 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
        ;
        local_228 = "";
        local_240 = &boost::unit_test::basic_cstring<char_const>::null;
        local_238 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x20;
        file_04.m_begin = (iterator)&local_230;
        msg_04.m_end = pvVar3;
        msg_04.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_240
                   ,msg_04);
        _Var1 = uri._M_dataplus;
        local_1b0.m_message.px =
             (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
        local_1b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_198 = "";
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"p1","");
        GetQueryParameterFromUri
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_a0,_Var1._M_p,&local_c0);
        if (local_80 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"v1");
          local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar2 == 0);
          local_100.m_message.px = (element_type *)0x0;
          local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_110 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_108 = "";
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
          aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          aStack_48._8_8_ = &local_118;
          local_140._0_8_ = "v1";
          local_130[0] = '\0';
          local_140._8_8_ = &PTR__lazy_ostream_013d5440;
          local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
          local_120 = (string *)local_140;
          pvVar3 = (iterator)0x2;
          local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_100,(lazy_ostream *)&local_1b0,1,2,REQUIRE,0xec319a,(size_t)&local_110,
                     0x20,local_58,"\"v1\"",assertion_descr);
          boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
          if (local_80 == true) {
            local_80 = false;
            if ((undefined1 *)local_a0._0_8_ != local_90) {
              operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          pvVar4 = (iterator)0x2c;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&uri,0,uri._M_string_length,"/rest/endpoint/someresource.json&p1=v1&p2=v2",0x2c
                    );
          local_250 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_248 = "";
          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x24;
          file_05.m_begin = (iterator)&local_250;
          msg_05.m_end = pvVar3;
          msg_05.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_260,msg_05);
          _Var1 = uri._M_dataplus;
          local_58._0_8_ = &aStack_48;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"p1","");
          _cVar5 = 0x3f8178;
          GetQueryParameterFromUri
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0,_Var1._M_p,(string *)local_58);
          local_1b0._0_8_ = CONCAT71(local_1b0._1_7_,local_80) ^ 1;
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_c0._M_dataplus._M_p = "!GetQueryParameterFromUri(uri.c_str(), \"p1\").has_value()";
          local_c0._M_string_length = 0xec3164;
          local_130[0] = '\0';
          local_140._8_8_ = &PTR__lazy_ostream_013d3df0;
          local_130._8_8_ = boost::unit_test::lazy_ostream::inst;
          local_270 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_268 = "";
          pvVar3 = (iterator)0x0;
          local_120 = &local_c0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)(local_140 + 8),1,0,WARN,_cVar5,(size_t)&local_270,
                     0x24);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          if (local_80 == true) {
            local_80 = false;
            if ((undefined1 *)local_a0._0_8_ != local_90) {
              operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._0_8_ != &aStack_48) {
            operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
          }
          pvVar4 = (iterator)0x2d;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&uri,0,uri._M_string_length,"/rest/endpoint/someresource.json&p1=v1&p2=v2%",
                     0x2d);
          local_280 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_278 = "";
          local_290 = &boost::unit_test::basic_cstring<char_const>::null;
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = &DAT_00000028;
          file_06.m_begin = (iterator)&local_280;
          msg_06.m_end = pvVar3;
          msg_06.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_290,msg_06);
          _Var1 = uri._M_dataplus;
          local_a0._0_8_ = local_90;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"p1","");
          GetQueryParameterFromUri
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8,_Var1._M_p,(string *)local_a0);
          if (local_c8 == true) {
            local_c8 = false;
            if (local_e8._M_value._M_dataplus._M_p !=
                (_Alloc_hider)((long)&local_e8._M_value + 0x10)) {
              operator_delete((void *)local_e8._M_value._M_dataplus._M_p,local_e8._16_8_ + 1);
            }
          }
          if ((undefined1 *)local_a0._0_8_ != local_90) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
          }
          local_2a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_298 = "";
          local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar5 = 0x3f8394;
          file_07.m_end = &DAT_00000028;
          file_07.m_begin = (iterator)&local_2a0;
          msg_07.m_end = pvVar3;
          msg_07.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_2b0,msg_07);
          local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_a0[8] = 0;
          local_a0._0_8_ = &PTR__lazy_ostream_013d45f0;
          local_90._0_8_ = boost::unit_test::lazy_ostream::inst;
          local_90._8_8_ = "exception std::runtime_error expected but not raised";
          local_2c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_2b8 = "";
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,1,WARN,_cVar5,
                     (size_t)&local_2c0,0x28);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uri._M_dataplus._M_p != &uri.field_2) {
            operator_delete(uri._M_dataplus._M_p,
                            CONCAT71(uri.field_2._M_allocated_capacity._1_7_,
                                     uri.field_2._M_local_buf[0]) + 1);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return;
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_query_parameters)
{
    std::string uri {};

    // No parameters
    uri = "localhost:8080/rest/headers/someresource.json";
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p1").has_value());

    // Single parameter
    uri = "localhost:8080/rest/endpoint/someresource.json?p1=v1";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p2").has_value());

    // Multiple parameters
    uri = "/rest/endpoint/someresource.json?p1=v1&p2=v2";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p2").value(), "v2");

    // If the query string contains duplicate keys, the first value is returned
    uri = "/rest/endpoint/someresource.json?p1=v1&p1=v2";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");

    // Invalid query string syntax is the same as not having parameters
    uri = "/rest/endpoint/someresource.json&p1=v1&p2=v2";
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p1").has_value());

    // URI with invalid characters (%) raises a runtime error regardless of which query parameter is queried
    uri = "/rest/endpoint/someresource.json&p1=v1&p2=v2%";
    BOOST_CHECK_EXCEPTION(GetQueryParameterFromUri(uri.c_str(), "p1"), std::runtime_error, HasReason("URI parsing failed, it likely contained RFC 3986 invalid characters"));
}